

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void VW::clean_example(vw *all,example *ec,bool rewind)

{
  uint64_t *puVar1;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,rewind) != 0) {
    puVar1 = &all->p->begin_parsed_examples;
    *puVar1 = *puVar1 - 1;
  }
  empty_example(all,ec);
  ec->in_use = false;
  object_pool<example,_example_initializer>::return_object(&all->p->example_pool,ec);
  return;
}

Assistant:

void clean_example(vw& all, example& ec, bool rewind)
{
  if (rewind)
  {
    assert(all.p->begin_parsed_examples > 0);
    all.p->begin_parsed_examples--;
  }

  empty_example(all, ec);
  assert(ec.in_use);
  ec.in_use = false;
  all.p->example_pool.return_object(&ec);
}